

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_comm_bxor(jit_State *J)

{
  jit_State *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  TRef local_4;
  
  if ((in_RDI->fold).ins.field_0.op1 == (in_RDI->fold).ins.field_0.op2) {
    if ((0x604208U >> ((in_RDI->fold).ins.field_1.t.irt & 0x1f) & 1) == 0) {
      (in_RDI->fold).ins.field_1.op12 = 0;
      local_4 = 2;
    }
    else {
      local_4 = lj_ir_kint64(in_RDI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    }
  }
  else {
    local_4 = fold_comm_swap(in_RDI);
  }
  return local_4;
}

Assistant:

LJFOLD(BXOR any any)
LJFOLDF(comm_bxor)
{
  if (fins->op1 == fins->op2)  /* i xor i ==> 0 */
    return irt_is64(fins->t) ? INT64FOLD(0) : INTFOLD(0);
  return fold_comm_swap(J);
}